

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_tableref.cpp
# Opt level: O1

void __thiscall duckdb::BaseTableRef::Serialize(BaseTableRef *this,Serializer *serializer)

{
  TableRef::Serialize(&this->super_TableRef,serializer);
  Serializer::WritePropertyWithDefault<std::__cxx11::string>
            (serializer,200,"schema_name",&this->schema_name);
  Serializer::WritePropertyWithDefault<std::__cxx11::string>
            (serializer,0xc9,"table_name",&this->table_name);
  Serializer::WritePropertyWithDefault<duckdb::vector<std::__cxx11::string,true>>
            (serializer,0xca,"column_name_alias",&(this->super_TableRef).column_name_alias);
  Serializer::WritePropertyWithDefault<std::__cxx11::string>
            (serializer,0xcb,"catalog_name",&this->catalog_name);
  Serializer::
  WritePropertyWithDefault<duckdb::unique_ptr<duckdb::AtClause,std::default_delete<duckdb::AtClause>,true>>
            (serializer,0xcc,"at_clause",&this->at_clause);
  return;
}

Assistant:

void BaseTableRef::Serialize(Serializer &serializer) const {
	TableRef::Serialize(serializer);
	serializer.WritePropertyWithDefault<string>(200, "schema_name", schema_name);
	serializer.WritePropertyWithDefault<string>(201, "table_name", table_name);
	serializer.WritePropertyWithDefault<vector<string>>(202, "column_name_alias", column_name_alias);
	serializer.WritePropertyWithDefault<string>(203, "catalog_name", catalog_name);
	serializer.WritePropertyWithDefault<unique_ptr<AtClause>>(204, "at_clause", at_clause);
}